

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inversespectrogram.cpp
# Opt level: O2

int __thiscall
ncnn::InverseSpectrogram::forward
          (InverseSpectrogram *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  float *pfVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  int iVar15;
  undefined4 *puVar16;
  long lVar17;
  long lVar18;
  uint _h;
  undefined4 *puVar19;
  uint *puVar20;
  long lVar21;
  float *pfVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  int local_160;
  float local_118;
  float local_114;
  void *local_110;
  Mat local_108;
  Mat *local_c0;
  ulong local_b8;
  long local_b0;
  void *local_a8;
  void *local_a0;
  ulong local_98;
  ulong local_90;
  double local_88;
  double local_80;
  Mat local_78;
  
  uVar2 = bottom_blob->h;
  iVar3 = bottom_blob->c;
  iVar6 = this->n_fft / 2;
  iVar15 = iVar6 * 2;
  if (this->center == 0) {
    iVar15 = 0;
  }
  _h = (this->n_fft - iVar15) + (uVar2 - 1) * this->hoplen;
  sVar4 = bottom_blob->elemsize;
  if (this->returns == 0) {
    Mat::create(top_blob,2,_h,sVar4,opt->blob_allocator);
  }
  else {
    Mat::create(top_blob,_h,sVar4,opt->blob_allocator);
  }
  iVar15 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,this->n_fft + _h,sVar4,opt->workspace_allocator);
    iVar15 = -100;
    if ((local_78.data != (void *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
      iVar15 = top_blob->c * (int)top_blob->cstep;
      pvVar13 = top_blob->data;
      lVar18 = 0;
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      for (; iVar15 != (int)lVar18; lVar18 = lVar18 + 1) {
        *(undefined4 *)((long)pvVar13 + lVar18 * 4) = 0;
      }
      uVar11 = local_78.c * (int)local_78.cstep;
      uVar12 = 0;
      uVar10 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar10 = uVar12;
      }
      for (; (int)uVar10 != (int)uVar12; uVar12 = uVar12 + 1) {
        *(undefined4 *)((long)local_78.data + uVar12 * 4) = 0;
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      local_b8 = (ulong)uVar2;
      local_c0 = top_blob;
      for (uVar10 = 0; uVar10 != local_b8; uVar10 = uVar10 + 1) {
        local_108.cstep = 0;
        local_108.data = (void *)0x0;
        local_108.refcount._0_4_ = 0;
        local_108.refcount._4_4_ = 0;
        local_108.elemsize._0_4_ = 0;
        local_108.elemsize._4_4_ = 0;
        local_108.elempack = 0;
        local_108.h = 0;
        local_108.d = 0;
        local_108.c = 0;
        local_108.allocator = (Allocator *)0x0;
        local_108.dims = 0;
        local_108.w = 0;
        Mat::create(&local_108,2,this->n_fft,4,(Allocator *)0x0);
        uVar2 = this->n_fft;
        if (iVar3 == iVar6 + 1) {
          iVar8 = (int)uVar2 / 2;
          sVar4 = bottom_blob->elemsize;
          puVar16 = (undefined4 *)((long)local_108.data + 4);
          iVar15 = -1;
          if (-1 < iVar8) {
            iVar15 = iVar8;
          }
          uVar12 = (ulong)(iVar15 + 1);
          puVar19 = (undefined4 *)
                    ((long)bottom_blob->data + sVar4 * uVar10 * (long)bottom_blob->w + 4);
          sVar5 = bottom_blob->cstep;
          while (bVar23 = uVar12 != 0, uVar12 = uVar12 - 1, bVar23) {
            puVar16[-1] = puVar19[-1];
            *puVar16 = *puVar19;
            puVar19 = (undefined4 *)((long)puVar19 + sVar4 * sVar5);
            puVar16 = (undefined4 *)
                      ((long)puVar16 +
                      (long)local_108.w *
                      CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
          }
          pvVar13 = bottom_blob->data;
          sVar4 = bottom_blob->elemsize;
          sVar5 = bottom_blob->cstep;
          iVar15 = this->n_fft;
          lVar18 = (long)iVar8 + 1;
          lVar17 = (long)local_108.w *
                   CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          puVar20 = (uint *)((long)local_108.data + lVar17 * lVar18 + 4);
          uVar12 = ~(long)iVar8;
          lVar21 = (long)bottom_blob->w * uVar10;
          for (; lVar18 < (int)uVar2; lVar18 = lVar18 + 1) {
            puVar20[-1] = *(uint *)((long)pvVar13 +
                                   ((uVar12 + (long)(int)uVar2) * sVar5 + lVar21) * sVar4);
            *puVar20 = *(uint *)((long)pvVar13 +
                                (((long)iVar15 + uVar12) * sVar5 + lVar21) * sVar4 + 4) ^ 0x80000000
            ;
            puVar20 = (uint *)((long)puVar20 + lVar17);
            pvVar13 = (void *)((long)pvVar13 - sVar5 * sVar4);
          }
        }
        else {
          sVar4 = bottom_blob->elemsize;
          puVar16 = (undefined4 *)((long)local_108.data + 4);
          uVar12 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar12 = 0;
          }
          puVar19 = (undefined4 *)
                    ((long)bottom_blob->data + sVar4 * uVar10 * (long)bottom_blob->w + 4);
          sVar5 = bottom_blob->cstep;
          while (bVar23 = uVar12 != 0, uVar12 = uVar12 - 1, bVar23) {
            puVar16[-1] = puVar19[-1];
            *puVar16 = *puVar19;
            puVar19 = (undefined4 *)((long)puVar19 + sVar4 * sVar5);
            puVar16 = (undefined4 *)
                      ((long)puVar16 +
                      (long)local_108.w *
                      CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
          }
        }
        if (this->normalized == 2) {
          fVar24 = *(float *)((long)(this->window_data).data + (long)this->n_fft * 4);
          uVar2 = this->n_fft * 2;
          uVar12 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar12 = 0;
          }
          for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)local_108.data + uVar14 * 4) =
                 *(float *)((long)local_108.data + uVar14 * 4) * fVar24;
          }
        }
        else if (this->normalized == 1) {
          iVar15 = this->n_fft;
          uVar2 = iVar15 * 2;
          uVar12 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar12 = 0;
          }
          for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)local_108.data + uVar14 * 4) =
                 *(float *)((long)local_108.data + uVar14 * 4) * SQRT((float)iVar15);
          }
        }
        uVar2 = this->n_fft;
        iVar15 = this->returns;
        local_a0 = (this->window_data).data;
        local_160 = (int)uVar10;
        local_98 = (ulong)(uint)(this->hoplen * local_160);
        iVar8 = (int)uVar2 / -2;
        local_b0 = (long)top_blob->w * top_blob->elemsize;
        local_90 = 0;
        if (0 < (int)uVar2) {
          local_90 = (ulong)uVar2;
        }
        local_a8 = local_78.data;
        local_110 = top_blob->data;
        if (this->center != 1) {
          iVar8 = 0;
        }
        local_88 = 1.0 / (double)(int)uVar2;
        for (uVar12 = 0; top_blob = local_c0, uVar12 != local_90; uVar12 = uVar12 + 1) {
          local_80 = (double)(int)uVar12 * 6.283185307179586;
          lVar17 = (long)local_108.w;
          lVar18 = CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          pfVar22 = (float *)((long)local_108.data + 4);
          fVar26 = 0.0;
          fVar24 = 0.0;
          for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
            sincosf((float)((double)(int)uVar14 * local_80 * local_88),&local_114,&local_118);
            fVar26 = (pfVar22[-1] * local_118 + fVar26) - *pfVar22 * local_114;
            fVar24 = pfVar22[-1] * local_114 + fVar24 + *pfVar22 * local_118;
            pfVar22 = (float *)((long)pfVar22 + lVar17 * lVar18);
          }
          uVar11 = (int)local_98 + (int)uVar12 + iVar8;
          if ((-1 < (int)uVar11) && ((int)uVar11 < (int)_h)) {
            fVar1 = *(float *)((long)local_a0 + uVar12 * 4);
            uVar14 = (ulong)uVar11;
            fVar25 = fVar24 * fVar1 * (1.0 / (float)(int)uVar2);
            *(float *)((long)local_a8 + uVar14 * 4) =
                 fVar1 * fVar1 + *(float *)((long)local_a8 + uVar14 * 4);
            pfVar22 = (float *)((long)local_110 + uVar14 * 4);
            fVar24 = fVar25;
            if ((iVar15 != 2) && (fVar24 = fVar1 * fVar26 * (1.0 / (float)(int)uVar2), iVar15 != 1))
            {
              if (iVar15 != 0) goto LAB_00530d97;
              pfVar9 = (float *)((long)local_110 + uVar14 * local_b0);
              pfVar22 = pfVar9 + 1;
              *pfVar9 = fVar24 + *pfVar9;
              fVar24 = fVar25;
            }
            *pfVar22 = fVar24 + *pfVar22;
          }
LAB_00530d97:
        }
        piVar7 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              free(local_108.data);
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      pvVar13 = top_blob->data;
      if (this->returns == 0) {
        iVar3 = top_blob->w;
        sVar4 = top_blob->elemsize;
        iVar15 = 0;
        uVar10 = (ulong)_h;
        if ((int)_h < 1) {
          uVar10 = 0;
        }
        pfVar22 = (float *)((long)pvVar13 + 4);
        for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
          fVar24 = *(float *)((long)local_78.data + uVar12 * 4);
          if (fVar24 != 0.0) {
            pfVar22[-1] = pfVar22[-1] / fVar24;
            *pfVar22 = *pfVar22 / *(float *)((long)local_78.data + uVar12 * 4);
          }
          pfVar22 = (float *)((long)pfVar22 + (long)iVar3 * sVar4);
        }
      }
      else {
        iVar15 = 0;
        uVar10 = (ulong)_h;
        if ((int)_h < 1) {
          uVar10 = 0;
        }
        for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
          fVar24 = *(float *)((long)local_78.data + uVar12 * 4);
          if (fVar24 != 0.0) {
            *(float *)((long)pvVar13 + uVar12 * 4) = *(float *)((long)pvVar13 + uVar12 * 4) / fVar24
            ;
          }
        }
      }
    }
    piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar15;
}

Assistant:

int InverseSpectrogram::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // https://github.com/librosa/librosa/blob/main/librosa/core/spectrum.py#L630

    // TODO custom window
    // TODO output length

    const int frames = bottom_blob.h;
    const int freqs = bottom_blob.c;
    // assert freqs == n_fft or freqs == n_fft / 2 + 1

    const int onesided = freqs == n_fft / 2 + 1 ? 1 : 0;

    const int outsize = center ? (frames - 1) * hoplen + (n_fft - n_fft / 2 * 2) : (frames - 1) * hoplen + n_fft;

    const size_t elemsize = bottom_blob.elemsize;

    if (returns == 0)
    {
        top_blob.create(2, outsize, elemsize, opt.blob_allocator);
    }
    else
    {
        top_blob.create(outsize, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    Mat window_sumsquare(outsize + n_fft, elemsize, opt.workspace_allocator);
    if (window_sumsquare.empty())
        return -100;

    top_blob.fill(0.f);
    window_sumsquare.fill(0.f);

    for (int j = 0; j < frames; j++)
    {
        // collect complex
        Mat sp(2, n_fft);
        if (onesided == 1)
        {
            for (int k = 0; k < n_fft / 2 + 1; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(k).row(j)[0];
                sp.row(k)[1] = bottom_blob.channel(k).row(j)[1];
            }
            for (int k = n_fft / 2 + 1; k < n_fft; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(n_fft - k).row(j)[0];
                sp.row(k)[1] = -bottom_blob.channel(n_fft - k).row(j)[1];
            }
        }
        else
        {
            for (int k = 0; k < n_fft; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(k).row(j)[0];
                sp.row(k)[1] = bottom_blob.channel(k).row(j)[1];
            }
        }

        if (normalized == 1)
        {
            float norm = sqrt(n_fft);
            for (int i = 0; i < 2 * n_fft; i++)
            {
                sp[i] *= norm;
            }
        }
        if (normalized == 2)
        {
            float norm = window_data[n_fft];
            for (int i = 0; i < 2 * n_fft; i++)
            {
                sp[i] *= norm;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < n_fft; i++)
        {
            // inverse dft
            float re = 0.f;
            float im = 0.f;
            for (int k = 0; k < n_fft; k++)
            {
                double angle = 2 * 3.14159265358979323846 * i * k / n_fft;

                re += sp.row(k)[0] * cosf(angle) - sp.row(k)[1] * sinf(angle);
                im += sp.row(k)[0] * sinf(angle) + sp.row(k)[1] * cosf(angle);
            }

            re /= n_fft;
            im /= n_fft;

            // apply window
            re *= window_data[i];
            im *= window_data[i];

            int output_index = j * hoplen + i;
            if (center == 1)
            {
                output_index -= n_fft / 2;
            }
            if (output_index >= 0 && output_index < outsize)
            {
                // square window
                window_sumsquare[output_index] += window_data[i] * window_data[i];

                if (returns == 0)
                {
                    top_blob.row(output_index)[0] += re;
                    top_blob.row(output_index)[1] += im;
                }
                if (returns == 1)
                {
                    top_blob[output_index] += re;
                }
                if (returns == 2)
                {
                    top_blob[output_index] += im;
                }
            }
        }
    }

    // square window norm
    if (returns == 0)
    {
        for (int i = 0; i < outsize; i++)
        {
            if (window_sumsquare[i] != 0.f)
            {
                top_blob.row(i)[0] /= window_sumsquare[i];
                top_blob.row(i)[1] /= window_sumsquare[i];
            }
        }
    }
    else
    {
        for (int i = 0; i < outsize; i++)
        {
            if (window_sumsquare[i] != 0.f)
                top_blob[i] /= window_sumsquare[i];
        }
    }

    return 0;
}